

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

_outconnect * linetraverser_next(t_linetraverser *t)

{
  int iVar1;
  _widgetbehavior *p_Var2;
  t_getrectfn p_Var3;
  int iVar4;
  int iVar5;
  _outconnect *p_Var6;
  undefined4 extraout_var;
  _glist *extraout_RAX;
  _glist *p_Var7;
  _gobj **pp_Var8;
  t_object *x;
  undefined4 extraout_var_00;
  _outconnect *lastconnect;
  int iVar9;
  _gobj *x_00;
  
  lastconnect = t->tr_nextoc;
  if (lastconnect == (_outconnect *)0x0) {
    do {
      iVar5 = t->tr_nextoutno;
      while (iVar5 == t->tr_nout) {
        if (t->tr_ob == (t_object *)0x0) {
          pp_Var8 = &t->tr_x->gl_list;
        }
        else {
          pp_Var8 = &(t->tr_ob->te_g).g_next;
        }
        for (x_00 = *pp_Var8; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
          x = pd_checkobject(&x_00->g_pd);
          if (x != (t_object *)0x0) goto LAB_00137df5;
        }
        x = (t_object *)0x0;
LAB_00137df5:
        if (x != (t_object *)0x0) {
          t->tr_ob = x;
          iVar5 = obj_noutlets(x);
          t->tr_nout = iVar5;
          if (((t->tr_x->field_0xe8 & 8) == 0) &&
             (p_Var7 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar5)),
             (p_Var7->field_0xe8 & 2) != 0)) {
            p_Var2 = x_00->g_pd->c_wb;
            if ((p_Var2 == (_widgetbehavior *)0x0) ||
               (p_Var3 = p_Var2->w_getrectfn, p_Var3 == (t_getrectfn)0x0)) {
              iVar5 = 0;
              t->tr_y11 = 0;
              t->tr_x11 = 0;
              t->tr_y12 = 10;
              t->tr_x12 = 10;
              goto LAB_00137e2d;
            }
            (*p_Var3)(x_00,t->tr_x,&t->tr_x11,&t->tr_y11,&t->tr_x12,&t->tr_y12);
          }
          else {
            t->tr_x11 = 0;
            t->tr_y11 = 0;
            t->tr_x12 = 0;
            t->tr_y12 = 0;
          }
          iVar5 = 0;
        }
LAB_00137e2d:
        if (x == (t_object *)0x0) {
          return (_outconnect *)0x0;
        }
      }
      t->tr_nextoutno = iVar5 + 1;
      lastconnect = obj_starttraverseoutlet(t->tr_ob,&t->tr_outlet,iVar5);
      t->tr_outno = iVar5;
    } while (lastconnect == (_outconnect *)0x0);
  }
  p_Var6 = obj_nexttraverseoutlet(lastconnect,&t->tr_ob2,&t->tr_inlet,&t->tr_inno);
  t->tr_nextoc = p_Var6;
  iVar5 = obj_ninlets(t->tr_ob2);
  p_Var7 = (_glist *)CONCAT44(extraout_var,iVar5);
  t->tr_nin = iVar5;
  if (iVar5 == 0) {
    bug("drawline");
    p_Var7 = extraout_RAX;
  }
  if (((t->tr_x->field_0xe8 & 8) == 0) &&
     (p_Var7 = glist_getcanvas(p_Var7), (p_Var7->field_0xe8 & 2) != 0)) {
    iVar5 = t->tr_nin + -1;
    if (t->tr_nin == 1) {
      iVar5 = 1;
    }
    iVar9 = t->tr_nout + -1;
    if (t->tr_nout == 1) {
      iVar9 = 1;
    }
    iVar1 = t->tr_x->gl_zoom;
    iVar4 = iVar1 * 3;
    iVar1 = iVar1 * -7;
    p_Var2 = ((t->tr_ob2->te_g).g_pd)->c_wb;
    if ((p_Var2 == (_widgetbehavior *)0x0) ||
       (p_Var3 = p_Var2->w_getrectfn, p_Var3 == (t_getrectfn)0x0)) {
      t->tr_y21 = 0;
      t->tr_x21 = 0;
      t->tr_y22 = 10;
      t->tr_x22 = 10;
    }
    else {
      (*p_Var3)(&t->tr_ob2->te_g,t->tr_x,&t->tr_x21,&t->tr_y21,&t->tr_x22,&t->tr_y22);
    }
    t->tr_lx1 = t->tr_x11 + iVar4 + (((iVar1 - t->tr_x11) + t->tr_x12) * t->tr_outno) / iVar9;
    t->tr_ly1 = t->tr_y12;
    t->tr_lx2 = t->tr_x21 + iVar4 + (((iVar1 - t->tr_x21) + t->tr_x22) * t->tr_inno) / iVar5;
    t->tr_ly2 = t->tr_y21;
  }
  else {
    t->tr_lx1 = 0;
    t->tr_ly1 = 0;
    t->tr_lx2 = 0;
    t->tr_ly2 = 0;
    t->tr_x21 = 0;
    t->tr_y21 = 0;
    t->tr_x22 = 0;
    t->tr_y22 = 0;
  }
  return lastconnect;
}

Assistant:

t_outconnect *linetraverser_next(t_linetraverser *t)
{
    t_outconnect *rval = t->tr_nextoc;
    int outno;
    while (!rval)
    {
        outno = t->tr_nextoutno;
        while (outno == t->tr_nout)
        {
            t_gobj *y;
            t_object *ob = 0;
            if (!t->tr_ob) y = t->tr_x->gl_list;
            else y = t->tr_ob->ob_g.g_next;
            for (; y; y = y->g_next)
                if ((ob = pd_checkobject(&y->g_pd))) break;
            if (!ob) return (0);
            t->tr_ob = ob;
            t->tr_nout = obj_noutlets(ob);
            outno = 0;
            if (glist_isvisible(t->tr_x))
                gobj_getrect(y, t->tr_x,
                    &t->tr_x11, &t->tr_y11, &t->tr_x12, &t->tr_y12);
            else t->tr_x11 = t->tr_y11 = t->tr_x12 = t->tr_y12 = 0;
        }
        t->tr_nextoutno = outno + 1;
        rval = obj_starttraverseoutlet(t->tr_ob, &t->tr_outlet, outno);
        t->tr_outno = outno;
    }
    t->tr_nextoc = obj_nexttraverseoutlet(rval, &t->tr_ob2,
        &t->tr_inlet, &t->tr_inno);
    t->tr_nin = obj_ninlets(t->tr_ob2);
    if (!t->tr_nin) bug("drawline");
    if (glist_isvisible(t->tr_x))
    {
        int inplus = (t->tr_nin == 1 ? 1 : t->tr_nin - 1);
        int outplus = (t->tr_nout == 1 ? 1 : t->tr_nout - 1);
        int iow = IOWIDTH * t->tr_x->gl_zoom;
        int iom = IOMIDDLE * t->tr_x->gl_zoom;
        gobj_getrect(&t->tr_ob2->ob_g, t->tr_x,
            &t->tr_x21, &t->tr_y21, &t->tr_x22, &t->tr_y22);
        t->tr_lx1 = t->tr_x11 +
            ((t->tr_x12 - t->tr_x11 - iow) * t->tr_outno) /
                outplus + iom;
        t->tr_ly1 = t->tr_y12;
        t->tr_lx2 = t->tr_x21 +
            ((t->tr_x22 - t->tr_x21 - iow) * t->tr_inno)/inplus +
                iom;
        t->tr_ly2 = t->tr_y21;
    }
    else
    {
        t->tr_x21 = t->tr_y21 = t->tr_x22 = t->tr_y22 = 0;
        t->tr_lx1 = t->tr_ly1 = t->tr_lx2 = t->tr_ly2 = 0;
    }

    return (rval);
}